

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O2

void __thiscall duckdb::LogicalOperator::Print(LogicalOperator *this)

{
  string sStack_28;
  
  (*this->_vptr_LogicalOperator[5])(&sStack_28,this,0);
  Printer::Print(&sStack_28);
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void LogicalOperator::Print() {
	Printer::Print(ToString());
}